

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O0

void * __thiscall
MyDB_LRU::evictAndReplace
          (MyDB_LRU *this,pair<std::shared_ptr<MyDB_Table>,_long> *curId,MyDB_PageBase *page)

{
  pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*> local_50;
  void *local_30;
  void *res;
  Node *node;
  MyDB_PageBase *page_local;
  pair<std::shared_ptr<MyDB_Table>,_long> *curId_local;
  MyDB_LRU *this_local;
  
  res = this->tail->pre;
  while ((*(byte *)(*(long *)((long)res + 0x10) + 8) & 1) == 1) {
    res = *res;
  }
  *(undefined8 *)(*res + 8) = *(undefined8 *)((long)res + 8);
  **(undefined8 **)((long)res + 8) = *res;
  node = (Node *)page;
  page_local = (MyDB_PageBase *)curId;
  curId_local = (pair<std::shared_ptr<MyDB_Table>,_long> *)this;
  if (*(int *)(*(long *)((long)res + 0x10) + 0xc) == -1) {
    MyDB_PageBase::writeToDisk
              (*(MyDB_PageBase **)((long)res + 0x10),(void *)**(undefined8 **)((long)res + 0x10));
  }
  else if (*(int *)(*(long *)((long)res + 0x10) + 0x14) != 0) {
    MyDB_PageBase::writeToDisk
              (*(MyDB_PageBase **)((long)res + 0x10),(void *)**(undefined8 **)((long)res + 0x10));
  }
  std::
  map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  ::erase(&this->LRUmap,(key_type *)(*(long *)((long)res + 0x10) + 0x18));
  local_30 = (void *)**(undefined8 **)((long)res + 0x10);
  **(undefined8 **)((long)res + 0x10) = 0;
  *(Node **)((long)res + 0x10) = node;
  *(Node **)((long)res + 8) = this->head->next;
  *(Node **)res = this->head;
  this->head->next->pre = (Node *)res;
  this->head->next = (Node *)res;
  std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>::
  pair<std::pair<std::shared_ptr<MyDB_Table>,_long>_&,_Node_*&,_true>(&local_50,curId,(Node **)&res)
  ;
  std::
  map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  ::insert(&this->LRUmap,&local_50);
  std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>::~pair(&local_50);
  return local_30;
}

Assistant:

void* MyDB_LRU:: evictAndReplace(pair<MyDB_TablePtr, long> curId, MyDB_PageBase* page) {

    Node* node = this -> tail -> pre;
    while (node -> page -> isPined == true) {
        node = node->pre;
    }
    node -> pre -> next = node -> next;
    node -> next -> pre = node -> pre;

    // consider if write the data back to the disk
    // if this page is a normal page
    if (node -> page -> slotId == -1) {
        node -> page -> writeToDisk(node -> page -> addr);

    }
    // if this page is anonymous page
    else {
        if (node -> page -> handleCount != 0) {
            node -> page -> writeToDisk(node -> page -> addr);
        }
    }

    this -> LRUmap.erase(node -> page -> pageId);

    void* res = node -> page -> addr;
    node -> page -> addr = nullptr;
    //delete node;
    node -> page = page;
    node -> next = this -> head -> next;
    node -> pre = this -> head;
    this -> head -> next -> pre = node;
    this -> head -> next = node;

    this -> LRUmap.insert(map<pair<MyDB_TablePtr, long>, Node*>::value_type(curId, node));
    return res;
}